

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getHighsOptionValue(Highs *this,string *option,string *value)

{
  HighsStatus HVar1;
  string *in_stack_ffffffffffffff68;
  Highs *this_00;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  undefined1 local_39 [57];
  
  alt_method_name = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_39 + 1),"getHighsOptionValue",(allocator *)alt_method_name);
  this_00 = (Highs *)&stack0xffffffffffffff8f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"getOptionValue",(allocator *)this_00);
  deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  HVar1 = getOptionValue(this_00,in_stack_ffffffffffffff68,(string *)0x4d4892);
  return HVar1;
}

Assistant:

HighsStatus Highs::getHighsOptionValue(const std::string& option,
                                       std::string& value) {
  deprecationMessage("getHighsOptionValue", "getOptionValue");
  return getOptionValue(option, value);
}